

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_host.hpp
# Opt level: O2

Map_conflict2 * __thiscall
chains::
ModuleHost<chains::phasor::Module,std::tuple<chains::Parameter<chains::phasor::Frequency>>,chains::Expose<chains::phasor::Frequency>>
::makeInputMap<std::tuple,chains::Parameter<chains::phasor::Frequency>>
          (Map_conflict2 *__return_storage_ptr__,void *this,
          tuple<chains::Parameter<chains::phasor::Frequency>_> *parameters)

{
  pair<boost::hana::type_impl<chains::phasor::Frequency>::_,_chains::CallbackInput> *pairs;
  CallbackInput CStack_68;
  CallbackInput local_40;
  
  local_40.value_ =
       (parameters->super__Tuple_impl<0UL,_chains::Parameter<chains::phasor::Frequency>_>).
       super__Head_base<0UL,_chains::Parameter<chains::phasor::Frequency>,_false>._M_head_impl.
       defaultValue_;
  local_40.callback_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_40.callback_.super__Function_base._M_functor._8_8_ = 0;
  local_40.callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_40.callback_._M_invoker = (_Invoker_type)0x0;
  CallbackInput::CallbackInput(&CStack_68,&local_40);
  boost::hana::make_impl<boost::hana::map_tag,void>::
  apply<boost::hana::pair<boost::hana::type_impl<chains::phasor::Frequency>::_,chains::CallbackInput>>
            (__return_storage_ptr__,(make_impl<boost::hana::map_tag,void> *)&CStack_68,pairs);
  std::_Function_base::~_Function_base(&CStack_68.callback_.super__Function_base);
  std::_Function_base::~_Function_base(&local_40.callback_.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

auto makeInputMap(const Tuple<Parameter...>& parameters) const
  {
    using namespace boost::hana;
    return make_map(make_pair(
      type_c<typename Parameter::Traits>,
      std::get<Parameter>(parameters)
        .template makeInput<typeIsInPack<typename Parameter::Traits, Exposed...>>())...);
  }